

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.cc
# Opt level: O0

int ArmCpuCaps(char *cpuinfo_name)

{
  FILE *__stream;
  char *pcVar1;
  char *in_RDI;
  char *p;
  FILE *f;
  char cpuinfo_line [512];
  long local_218 [67];
  
  __stream = fopen64(in_RDI,"r");
  if (__stream != (FILE *)0x0) {
    do {
      do {
        pcVar1 = fgets((char *)local_218,0x1ff,__stream);
        if (pcVar1 == (char *)0x0) {
          fclose(__stream);
          return 0;
        }
      } while (local_218[0] != 0x7365727574616546);
      pcVar1 = strstr((char *)local_218," neon");
      if ((pcVar1 != (char *)0x0) && ((pcVar1[5] == ' ' || (pcVar1[5] == '\n')))) {
        fclose(__stream);
        return 4;
      }
      pcVar1 = strstr((char *)local_218," asimd");
    } while (pcVar1 == (char *)0x0);
    fclose(__stream);
  }
  return 4;
}

Assistant:

LIBYUV_API SAFEBUFFERS int ArmCpuCaps(const char* cpuinfo_name) {
  char cpuinfo_line[512];
  FILE* f = fopen(cpuinfo_name, "r");
  if (!f) {
    // Assume Neon if /proc/cpuinfo is unavailable.
    // This will occur for Chrome sandbox for Pepper or Render process.
    return kCpuHasNEON;
  }
  while (fgets(cpuinfo_line, sizeof(cpuinfo_line) - 1, f)) {
    if (memcmp(cpuinfo_line, "Features", 8) == 0) {
      char* p = strstr(cpuinfo_line, " neon");
      if (p && (p[5] == ' ' || p[5] == '\n')) {
        fclose(f);
        return kCpuHasNEON;
      }
      // aarch64 uses asimd for Neon.
      p = strstr(cpuinfo_line, " asimd");
      if (p) {
        fclose(f);
        return kCpuHasNEON;
      }
    }
  }
  fclose(f);
  return 0;
}